

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

ctrl_t * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
::control(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          *this)

{
  bool bVar1;
  CommonFields *this_00;
  ctrl_t *pcVar2;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  *this_local;
  
  bVar1 = is_soo(this);
  if (bVar1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x1017,
                  "ctrl_t *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::control() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  this_00 = common(this);
  pcVar2 = CommonFields::control(this_00);
  return pcVar2;
}

Assistant:

ctrl_t* control() const {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    return common().control();
  }